

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lace14.h
# Opt level: O0

int lace_shrink_shared(WorkerP *w)

{
  uint uVar1;
  Worker *pWVar2;
  uint local_34;
  uint32_t newsplit;
  uint32_t split;
  uint32_t tail;
  TailSplitNA ts;
  Worker *wt;
  WorkerP *w_local;
  
  pWVar2 = w->_public;
  split = (pWVar2->ts).ts.tail;
  tail = (pWVar2->ts).ts.split;
  if (split != tail) {
    local_34 = split + tail >> 1;
    (pWVar2->ts).ts.split = local_34;
    uVar1 = (pWVar2->ts).ts.tail;
    if (uVar1 != tail) {
      if (local_34 < uVar1) {
        local_34 = uVar1 + tail >> 1;
        (pWVar2->ts).ts.split = local_34;
      }
      w->split = w->dq + local_34;
      return 0;
    }
  }
  pWVar2->allstolen = '\x01';
  w->allstolen = '\x01';
  return 1;
}

Assistant:

static int
lace_shrink_shared(WorkerP *w)
{
    Worker *wt = w->_public;
    TailSplitNA ts; /* Use non-atomic version to emit better code */
    ts.v = wt->ts.v; /* Force in 1 memory read */
    uint32_t tail = ts.ts.tail;
    uint32_t split = ts.ts.split;

    if (tail != split) {
        uint32_t newsplit = (tail + split)/2;
        atomic_store_explicit(&wt->ts.ts.split, newsplit, memory_order_relaxed); /* emit normal write */
        atomic_thread_fence(memory_order_seq_cst);
        tail = wt->ts.ts.tail;
        if (tail != split) {
            if (unlikely(tail > newsplit)) {
                newsplit = (tail + split) / 2;
                atomic_store_explicit(&wt->ts.ts.split, newsplit, memory_order_relaxed); /* emit normal write */
            }
            w->split = w->dq + newsplit;
            PR_COUNTSPLITS(w, CTR_split_shrink);
            return 0;
        }
    }

    wt->allstolen = 1;
    w->allstolen = 1;
    return 1;
}